

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_2UL>::get
          (SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_2UL> *this,
          ExceptionOrValue *output)

{
  ExceptionOrValue *pEVar1;
  long *plVar2;
  char *pcVar3;
  
  pEVar1 = ((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (pEVar1[1].exception.ptr.isSet == true) {
    if (output[1].exception.ptr.isSet == true) {
      output[1].exception.ptr.isSet = false;
      plVar2 = (long *)output[1].exception.ptr.field_1.value.ownFile.content.size_;
      if (plVar2 != (long *)0x0) {
        output[1].exception.ptr.field_1.value.ownFile.content.size_ = 0;
        pcVar3 = output[1].exception.ptr.field_1.value.ownFile.content.ptr;
        (*(code *)**(undefined8 **)pcVar3)(pcVar3,(long)plVar2 + *(long *)(*plVar2 + -0x10));
      }
    }
    output[1].exception.ptr.field_1.value.ownFile.content.ptr =
         *(char **)((long)&pEVar1[1].exception.ptr.field_1 + 0x20);
    output[1].exception.ptr.field_1.value.ownFile.content.size_ =
         (size_t)pEVar1[1].exception.ptr.field_1.value.description.content.ptr;
    pEVar1[1].exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    output[1].exception.ptr.isSet = true;
  }
  else if (output[1].exception.ptr.isSet == true) {
    output[1].exception.ptr.isSet = false;
    plVar2 = (long *)output[1].exception.ptr.field_1.value.ownFile.content.size_;
    if (plVar2 != (long *)0x0) {
      output[1].exception.ptr.field_1.value.ownFile.content.size_ = 0;
      pcVar3 = output[1].exception.ptr.field_1.value.ownFile.content.ptr;
      (*(code *)**(undefined8 **)pcVar3)(pcVar3,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
  }
  if (pEVar1 != output) {
    if ((output->exception).ptr.isSet == true) {
      (output->exception).ptr.isSet = false;
      Exception::~Exception(&(output->exception).ptr.field_1.value);
    }
    if ((pEVar1->exception).ptr.isSet == true) {
      Exception::Exception
                (&(output->exception).ptr.field_1.value,&(pEVar1->exception).ptr.field_1.value);
      (output->exception).ptr.isSet = true;
    }
  }
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(*value));
    } else {
      output.as<Element>().value = nullptr;
    }